

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

zip_t * zip_cstream_openwitherror(FILE *stream,int level,char mode,int *errnum)

{
  mz_bool mVar1;
  zip_t *local_30;
  zip_t *zip;
  int *errnum_local;
  char mode_local;
  int level_local;
  FILE *stream_local;
  
  local_30 = (zip_t *)0x0;
  *errnum = 0;
  if (stream == (FILE *)0x0) {
    *errnum = -0x13;
  }
  else {
    errnum_local._4_4_ = level;
    if (level < 0) {
      errnum_local._4_4_ = 6;
    }
    if ((errnum_local._4_4_ & 0xf) < 0xb) {
      local_30 = (zip_t *)calloc(1,0x4e078);
      if (local_30 == (zip_t *)0x0) {
        *errnum = -0x15;
      }
      else {
        local_30->level = errnum_local._4_4_;
        switch(mode) {
        case 'a':
        case 'd':
          mVar1 = mz_zip_reader_init_cfile
                            ((mz_zip_archive *)local_30,stream,0,local_30->level | 0x800);
          if (mVar1 == 0) {
            *errnum = -0x1e;
          }
          else {
            if ((mode != 'a') && (mode != 'd')) {
              return local_30;
            }
            mVar1 = mz_zip_writer_init_from_reader_v2((mz_zip_archive *)local_30,(char *)0x0,0);
            if (mVar1 != 0) {
              return local_30;
            }
            *errnum = -0x20;
            mz_zip_reader_end((mz_zip_archive *)local_30);
          }
          break;
        default:
          *errnum = -4;
          break;
        case 'r':
          mVar1 = mz_zip_reader_init_cfile
                            ((mz_zip_archive *)local_30,stream,0,local_30->level | 0x800);
          if (mVar1 != 0) {
            return local_30;
          }
          *errnum = -0x1e;
          break;
        case 'w':
          mVar1 = mz_zip_writer_init_cfile((mz_zip_archive *)local_30,stream,0x4000);
          if (mVar1 != 0) {
            return local_30;
          }
          *errnum = -0x1f;
        }
      }
    }
    else {
      *errnum = -5;
    }
  }
  if (local_30 != (zip_t *)0x0) {
    free(local_30);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_cstream_openwitherror(FILE *stream, int level, char mode,
                                        int *errnum) {
  struct zip_t *zip = NULL;
  *errnum = 0;
  if (!stream) {
    // zip archive stream is NULL
    *errnum = ZIP_ENOFILE;
    goto cleanup;
  }

  if (level < 0)
    level = MZ_DEFAULT_LEVEL;
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    *errnum = ZIP_EINVLVL;
    goto cleanup;
  }

  zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip) {
    // out of memory
    *errnum = ZIP_EOOMEM;
    goto cleanup;
  }

  zip->level = (mz_uint)level;
  switch (mode) {
  case 'w':
    // Create a new archive.
    if (!mz_zip_writer_init_cfile(&(zip->archive), stream,
                                  MZ_ZIP_FLAG_WRITE_ZIP64)) {
      // Cannot initialize zip_archive writer
      *errnum = ZIP_EWINIT;
      goto cleanup;
    }
    break;

  case 'r':
    if (!mz_zip_reader_init_cfile(
            &(zip->archive), stream, 0,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
    break;

  case 'a':
  case 'd':
    if (!mz_zip_reader_init_cfile(
            &(zip->archive), stream, 0,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
    if ((mode == 'a' || mode == 'd')) {
      if (!mz_zip_writer_init_from_reader_v2(&(zip->archive), NULL, 0)) {
        *errnum = ZIP_EWRINIT;
        mz_zip_reader_end(&(zip->archive));
        goto cleanup;
      }
    }
    break;

  default:
    *errnum = ZIP_EINVMODE;
    goto cleanup;
  }

  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}